

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<ot::commissioner::Channel_const&>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>>,std::tuple<ot::commissioner::Channel_const&,std::chrono::duration<long,std::ratio<1l,1000l>>>>
               (tuple<testing::Matcher<const_ot::commissioner::Channel_&>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                *matcher_tuple,
               tuple<const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
               *value_tuple)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<ot::commissioner::Channel_const&>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>>,std::tuple<ot::commissioner::Channel_const&,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    bVar1 = MatcherBase<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Matches
                      ((MatcherBase<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
                       matcher_tuple,(duration<long,_std::ratio<1L,_1000L>_> *)value_tuple);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }